

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_mul_shift_var
               (secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b,uint shift)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint in_ECX;
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  ulong *in_RDI;
  uint shifthigh;
  uint shiftlow;
  uint shiftlimbs;
  uint64_t l [8];
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  ulong local_90;
  ulong local_88;
  uint64_t local_68 [9];
  uint local_1c;
  secp256k1_scalar *local_18;
  secp256k1_scalar *local_10;
  ulong *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_scalar_verify((secp256k1_scalar *)0x135fb3);
  secp256k1_scalar_verify((secp256k1_scalar *)0x135fc0);
  if (local_1c < 0x100) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/scalar_4x64_impl.h"
            ,0x380,"test condition failed: shift >= 256");
    abort();
  }
  secp256k1_scalar_mul_512(local_68,local_10,local_18);
  uVar2 = local_1c >> 6;
  uVar3 = local_1c & 0x3f;
  sVar1 = (sbyte)uVar3;
  bVar5 = 0x40 - sVar1;
  if (local_1c < 0x200) {
    if ((local_1c < 0x1c0) && (uVar3 != 0)) {
      local_88 = local_68[uVar2 + 1] << (bVar5 & 0x3f);
    }
    else {
      local_88 = 0;
    }
    local_90 = local_68[uVar2] >> sVar1 | local_88;
  }
  else {
    local_90 = 0;
  }
  *local_8 = local_90;
  if (local_1c < 0x1c0) {
    if ((local_1c < 0x180) && (uVar3 != 0)) {
      in_stack_ffffffffffffff60 = (secp256k1_scalar *)(local_68[uVar2 + 2] << (bVar5 & 0x3f));
    }
    else {
      in_stack_ffffffffffffff60 = (secp256k1_scalar *)0x0;
    }
    uVar4 = local_68[uVar2 + 1] >> sVar1 | (ulong)in_stack_ffffffffffffff60;
  }
  else {
    uVar4 = 0;
  }
  local_8[1] = uVar4;
  if (local_1c < 0x180) {
    if ((local_1c < 0x140) && (uVar3 != 0)) {
      local_b8 = local_68[uVar2 + 3] << (bVar5 & 0x3f);
    }
    else {
      local_b8 = 0;
    }
    local_c0 = local_68[uVar2 + 2] >> sVar1 | local_b8;
  }
  else {
    local_c0 = 0;
  }
  local_8[2] = local_c0;
  if (local_1c < 0x140) {
    local_c8 = local_68[uVar2 + 3] >> sVar1;
  }
  else {
    local_c8 = 0;
  }
  local_8[3] = local_c8;
  secp256k1_scalar_cadd_bit(in_stack_ffffffffffffff60,(uint)(uVar4 >> 0x20),(int)uVar4);
  secp256k1_scalar_verify((secp256k1_scalar *)0x136285);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_scalar_mul_shift_var(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b, unsigned int shift) {
    uint64_t l[8];
    unsigned int shiftlimbs;
    unsigned int shiftlow;
    unsigned int shifthigh;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);
    VERIFY_CHECK(shift >= 256);

    secp256k1_scalar_mul_512(l, a, b);
    shiftlimbs = shift >> 6;
    shiftlow = shift & 0x3F;
    shifthigh = 64 - shiftlow;
    r->d[0] = shift < 512 ? (l[0 + shiftlimbs] >> shiftlow | (shift < 448 && shiftlow ? (l[1 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[1] = shift < 448 ? (l[1 + shiftlimbs] >> shiftlow | (shift < 384 && shiftlow ? (l[2 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[2] = shift < 384 ? (l[2 + shiftlimbs] >> shiftlow | (shift < 320 && shiftlow ? (l[3 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[3] = shift < 320 ? (l[3 + shiftlimbs] >> shiftlow) : 0;
    secp256k1_scalar_cadd_bit(r, 0, (l[(shift - 1) >> 6] >> ((shift - 1) & 0x3f)) & 1);

    SECP256K1_SCALAR_VERIFY(r);
}